

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

void * dlpvalloc(size_t bytes)

{
  void *pvVar1;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  pvVar1 = dlmemalign(mparams.page_size,-mparams.page_size & (bytes + mparams.page_size) - 1);
  return pvVar1;
}

Assistant:

void* dlpvalloc(size_t bytes) {
  size_t pagesz;
  ensure_initialization();
  pagesz = mparams.page_size;
  return dlmemalign(pagesz, (bytes + pagesz - SIZE_T_ONE) & ~(pagesz - SIZE_T_ONE));
}